

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_ascii_strncasecmp(char *s1,char *s2,size_t n)

{
  char cVar1;
  char cVar2;
  char c2;
  size_t sStack_28;
  char c1;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  sStack_28 = n;
  n_local = (size_t)s2;
  s2_local = s1;
  do {
    if (sStack_28 == 0) {
      return 0;
    }
    cVar1 = EVUTIL_TOLOWER_(*s2_local);
    cVar2 = EVUTIL_TOLOWER_(*(char *)n_local);
    if (cVar1 < cVar2) {
      return -1;
    }
    if (cVar2 < cVar1) {
      return 1;
    }
    sStack_28 = sStack_28 - 1;
    n_local = n_local + 1;
    s2_local = s2_local + 1;
  } while (cVar1 != '\0');
  return 0;
}

Assistant:

int evutil_ascii_strncasecmp(const char *s1, const char *s2, size_t n)
{
	char c1, c2;
	while (n--) {
		c1 = EVUTIL_TOLOWER_(*s1++);
		c2 = EVUTIL_TOLOWER_(*s2++);
		if (c1 < c2)
			return -1;
		else if (c1 > c2)
			return 1;
		else if (c1 == 0)
			return 0;
	}
	return 0;
}